

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,Path *value)

{
  bool bVar1;
  string str;
  string local_108;
  Path local_e8;
  
  if (value == (Path *)0x0) {
    bVar1 = false;
  }
  else {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    local_108._M_string_length = 0;
    local_108.field_2._M_local_buf[0] = '\0';
    bVar1 = ReadPathIdentifier(this,&local_108);
    if (bVar1) {
      pathutil::FromString(&local_e8,&local_108);
      Path::operator=(value,&local_e8);
      Path::~Path(&local_e8);
    }
    ::std::__cxx11::string::_M_dispose();
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(Path *value) {
  if (value) {
    std::string str;
    if (!ReadPathIdentifier(&str)) {
      return false;
    }

    (*value) = pathutil::FromString(str);

    return true;
  } else {
    return false;
  }
}